

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O2

void btf_16_avx2(__m256i *w0,__m256i *w1,__m256i *in0,__m256i *in1,__m128i *out0,__m128i *out1,
                __m128i *out2,__m128i *out3,__m256i *__rounding,int8_t *cos_bit)

{
  __m256i alVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  uint uVar6;
  
  auVar5 = vpunpcklwd_avx2((undefined1  [32])*in0,(undefined1  [32])*in1);
  auVar4 = vpunpckhwd_avx2((undefined1  [32])*in0,(undefined1  [32])*in1);
  auVar2 = vpmaddwd_avx2(auVar5,(undefined1  [32])*w0);
  auVar3 = vpmaddwd_avx2(auVar4,(undefined1  [32])*w0);
  auVar5 = vpmaddwd_avx2(auVar5,(undefined1  [32])*w1);
  auVar4 = vpmaddwd_avx2(auVar4,(undefined1  [32])*w1);
  alVar1 = *__rounding;
  auVar2 = vpaddd_avx2((undefined1  [32])alVar1,auVar2);
  auVar3 = vpaddd_avx2((undefined1  [32])alVar1,auVar3);
  auVar5 = vpaddd_avx2((undefined1  [32])alVar1,auVar5);
  auVar4 = vpaddd_avx2((undefined1  [32])alVar1,auVar4);
  uVar6 = (uint)*cos_bit;
  auVar2 = vpsrad_avx2(auVar2,ZEXT416(uVar6));
  auVar3 = vpsrad_avx2(auVar3,ZEXT416(uVar6));
  auVar5 = vpsrad_avx2(auVar5,ZEXT416(uVar6));
  auVar2 = vpackssdw_avx2(auVar2,auVar3);
  auVar3 = vpsrad_avx2(auVar4,ZEXT416(uVar6));
  auVar3 = vpackssdw_avx2(auVar5,auVar3);
  *out0 = auVar2._0_16_;
  *out1 = auVar3._0_16_;
  *out2 = auVar2._16_16_;
  *out3 = auVar3._16_16_;
  return;
}

Assistant:

static inline void btf_16_avx2(__m256i *w0, __m256i *w1, __m256i *in0,
                               __m256i *in1, __m128i *out0, __m128i *out1,
                               __m128i *out2, __m128i *out3,
                               const __m256i *__rounding, int8_t *cos_bit) {
  __m256i t0 = _mm256_unpacklo_epi16(*in0, *in1);
  __m256i t1 = _mm256_unpackhi_epi16(*in0, *in1);
  __m256i u0 = _mm256_madd_epi16(t0, *w0);
  __m256i u1 = _mm256_madd_epi16(t1, *w0);
  __m256i v0 = _mm256_madd_epi16(t0, *w1);
  __m256i v1 = _mm256_madd_epi16(t1, *w1);

  __m256i a0 = _mm256_add_epi32(u0, *__rounding);
  __m256i a1 = _mm256_add_epi32(u1, *__rounding);
  __m256i b0 = _mm256_add_epi32(v0, *__rounding);
  __m256i b1 = _mm256_add_epi32(v1, *__rounding);

  __m256i c0 = _mm256_srai_epi32(a0, *cos_bit);
  __m256i c1 = _mm256_srai_epi32(a1, *cos_bit);
  __m256i d0 = _mm256_srai_epi32(b0, *cos_bit);
  __m256i d1 = _mm256_srai_epi32(b1, *cos_bit);

  __m256i temp0 = _mm256_packs_epi32(c0, c1);
  __m256i temp1 = _mm256_packs_epi32(d0, d1);

  *out0 = _mm256_castsi256_si128(temp0);
  *out1 = _mm256_castsi256_si128(temp1);
  *out2 = _mm256_extracti128_si256(temp0, 0x01);
  *out3 = _mm256_extracti128_si256(temp1, 0x01);
}